

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O2

void examine_app0(j_decompress_ptr cinfo,JOCTET *data,uint datalen,INT32 remaining)

{
  JOCTET JVar1;
  ulong uVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  byte bVar7;
  jpeg_error_mgr *pjVar8;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  ushort uVar12;
  ushort uVar13;
  long lVar14;
  
  lVar14 = (ulong)datalen + remaining;
  if (datalen < 0xe) {
    if ((5 < datalen) && (*data == 'J')) {
LAB_00236ebc:
      if (((data[1] == 'F') && (data[2] == 'X')) && ((data[3] == 'X' && (data[4] == '\0')))) {
        JVar1 = data[5];
        pjVar8 = cinfo->err;
        if (JVar1 == '\x13') {
          pjVar8->msg_code = 0x70;
        }
        else if (JVar1 == '\x11') {
          pjVar8->msg_code = 0x6f;
        }
        else {
          if (JVar1 != '\x10') {
            pjVar8->msg_code = 0x5b;
            *(uint *)&pjVar8->msg_parm = (uint)data[5];
            (cinfo->err->msg_parm).i[1] = (int)lVar14;
            goto LAB_00236ee6;
          }
          pjVar8->msg_code = 0x6e;
        }
        goto LAB_00236ee2;
      }
    }
LAB_00236ed8:
    pjVar8 = cinfo->err;
    pjVar8->msg_code = 0x4f;
  }
  else {
    if (*data != 'J') goto LAB_00236ed8;
    if ((((data[1] != 'F') || (data[2] != 'I')) || (data[3] != 'F')) || (data[4] != '\0'))
    goto LAB_00236ebc;
    cinfo->saw_JFIF_marker = 1;
    bVar10 = data[5];
    cinfo->JFIF_major_version = bVar10;
    bVar9 = data[6];
    cinfo->JFIF_minor_version = bVar9;
    bVar7 = data[7];
    cinfo->density_unit = bVar7;
    uVar12 = *(ushort *)(data + 8) << 8 | *(ushort *)(data + 8) >> 8;
    cinfo->X_density = uVar12;
    uVar13 = *(ushort *)(data + 10) << 8 | *(ushort *)(data + 10) >> 8;
    cinfo->Y_density = uVar13;
    if (bVar10 == 1) {
      uVar11 = 1;
      uVar2 = (ulong)CONCAT22(uVar13,uVar12);
    }
    else {
      pjVar8 = cinfo->err;
      pjVar8->msg_code = 0x7a;
      (pjVar8->msg_parm).i[0] = (uint)bVar10;
      *(uint *)((long)&cinfo->err->msg_parm + 4) = (uint)cinfo->JFIF_minor_version;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
      uVar11 = (uint)cinfo->JFIF_major_version;
      bVar9 = cinfo->JFIF_minor_version;
      bVar7 = cinfo->density_unit;
      uVar2._0_2_ = cinfo->X_density;
      uVar2._2_2_ = cinfo->Y_density;
      uVar2._4_4_ = cinfo->saw_Adobe_marker;
    }
    pjVar8 = cinfo->err;
    (pjVar8->msg_parm).i[0] = uVar11;
    *(uint *)((long)&pjVar8->msg_parm + 4) = (uint)bVar9;
    auVar3._8_4_ = 0;
    auVar3._0_8_ = uVar2;
    auVar3._12_2_ = (short)(uVar2 >> 0x30);
    auVar4._8_2_ = (short)(uVar2 >> 0x20);
    auVar4._0_8_ = uVar2;
    auVar4._10_4_ = auVar3._10_4_;
    auVar6._6_8_ = 0;
    auVar6._0_6_ = auVar4._8_6_;
    auVar5._6_8_ = SUB148(auVar6 << 0x40,6);
    auVar5._4_2_ = (short)(uVar2 >> 0x10);
    auVar5._2_2_ = 0;
    auVar5._0_2_ = (ushort)uVar2;
    *(long *)((long)&pjVar8->msg_parm + 8) = auVar5._0_8_;
    *(uint *)((long)&pjVar8->msg_parm + 0x10) = (uint)bVar7;
    pjVar8->msg_code = 0x59;
    (*pjVar8->emit_message)((j_common_ptr)cinfo,1);
    bVar10 = data[0xc];
    bVar9 = data[0xd];
    if (bVar9 != 0 || bVar10 != 0) {
      pjVar8 = cinfo->err;
      pjVar8->msg_code = 0x5c;
      *(uint *)&pjVar8->msg_parm = (uint)data[0xc];
      *(uint *)((long)&cinfo->err->msg_parm + 4) = (uint)data[0xd];
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
      bVar10 = data[0xc];
      bVar9 = data[0xd];
    }
    lVar14 = lVar14 + -0xe;
    if (lVar14 == (ulong)bVar9 * (ulong)bVar10 * 3) {
      return;
    }
    pjVar8 = cinfo->err;
    pjVar8->msg_code = 0x5a;
  }
LAB_00236ee2:
  (pjVar8->msg_parm).i[0] = (int)lVar14;
LAB_00236ee6:
  (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
  return;
}

Assistant:

LOCAL(void)
examine_app0 (j_decompress_ptr cinfo, JOCTET FAR * data,
	      unsigned int datalen, INT32 remaining)
/* Examine first few bytes from an APP0.
 * Take appropriate action if it is a JFIF marker.
 * datalen is # of bytes at data[], remaining is length of rest of marker data.
 */
{
  INT32 totallen = (INT32) datalen + remaining;

  if (datalen >= APP0_DATA_LEN &&
      GETJOCTET(data[0]) == 0x4A &&
      GETJOCTET(data[1]) == 0x46 &&
      GETJOCTET(data[2]) == 0x49 &&
      GETJOCTET(data[3]) == 0x46 &&
      GETJOCTET(data[4]) == 0) {
    /* Found JFIF APP0 marker: save info */
    cinfo->saw_JFIF_marker = TRUE;
    cinfo->JFIF_major_version = GETJOCTET(data[5]);
    cinfo->JFIF_minor_version = GETJOCTET(data[6]);
    cinfo->density_unit = GETJOCTET(data[7]);
    cinfo->X_density = (GETJOCTET(data[8]) << 8) + GETJOCTET(data[9]);
    cinfo->Y_density = (GETJOCTET(data[10]) << 8) + GETJOCTET(data[11]);
    /* Check version.
     * Major version must be 1, anything else signals an incompatible change.
     * (We used to treat this as an error, but now it's a nonfatal warning,
     * because some bozo at Hijaak couldn't read the spec.)
     * Minor version should be 0..2, but process anyway if newer.
     */
    if (cinfo->JFIF_major_version != 1)
      WARNMS2(cinfo, JWRN_JFIF_MAJOR,
	      cinfo->JFIF_major_version, cinfo->JFIF_minor_version);
    /* Generate trace messages */
    TRACEMS5(cinfo, 1, JTRC_JFIF,
	     cinfo->JFIF_major_version, cinfo->JFIF_minor_version,
	     cinfo->X_density, cinfo->Y_density, cinfo->density_unit);
    /* Validate thumbnail dimensions and issue appropriate messages */
    if (GETJOCTET(data[12]) | GETJOCTET(data[13]))
      TRACEMS2(cinfo, 1, JTRC_JFIF_THUMBNAIL,
	       GETJOCTET(data[12]), GETJOCTET(data[13]));
    totallen -= APP0_DATA_LEN;
    if (totallen !=
	((INT32)GETJOCTET(data[12]) * (INT32)GETJOCTET(data[13]) * (INT32) 3))
      TRACEMS1(cinfo, 1, JTRC_JFIF_BADTHUMBNAILSIZE, (int) totallen);
  } else if (datalen >= 6 &&
      GETJOCTET(data[0]) == 0x4A &&
      GETJOCTET(data[1]) == 0x46 &&
      GETJOCTET(data[2]) == 0x58 &&
      GETJOCTET(data[3]) == 0x58 &&
      GETJOCTET(data[4]) == 0) {
    /* Found JFIF "JFXX" extension APP0 marker */
    /* The library doesn't actually do anything with these,
     * but we try to produce a helpful trace message.
     */
    switch (GETJOCTET(data[5])) {
    case 0x10:
      TRACEMS1(cinfo, 1, JTRC_THUMB_JPEG, (int) totallen);
      break;
    case 0x11:
      TRACEMS1(cinfo, 1, JTRC_THUMB_PALETTE, (int) totallen);
      break;
    case 0x13:
      TRACEMS1(cinfo, 1, JTRC_THUMB_RGB, (int) totallen);
      break;
    default:
      TRACEMS2(cinfo, 1, JTRC_JFIF_EXTENSION,
	       GETJOCTET(data[5]), (int) totallen);
      break;
    }
  } else {
    /* Start of APP0 does not match "JFIF" or "JFXX", or too short */
    TRACEMS1(cinfo, 1, JTRC_APP0, (int) totallen);
  }
}